

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O0

void __thiscall cppcms::mount_point::mount_point(mount_point *this,selection_type sel,string *non)

{
  string *in_RDX;
  int in_ESI;
  regex *in_RDI;
  regex local_38 [8];
  regex local_30 [24];
  string *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  booster::regex::regex(in_RDI);
  booster::regex::regex(in_RDI + 8);
  booster::regex::regex(in_RDI + 0x10);
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(int *)(in_RDI + 0x1c) = local_c;
  booster::copy_ptr<cppcms::mount_point::_data>::copy_ptr
            ((copy_ptr<cppcms::mount_point::_data> *)(in_RDI + 0x20));
  if (local_c == 0) {
    booster::regex::regex(local_30,local_18,0);
    booster::regex::operator=(in_RDI + 8,local_30);
    booster::regex::~regex(local_30);
  }
  else {
    booster::regex::regex(local_38,local_18,0);
    booster::regex::operator=(in_RDI + 0x10,local_38);
    booster::regex::~regex(local_38);
  }
  return;
}

Assistant:

mount_point::mount_point(mount_point::selection_type sel,std::string const &non) :
	group_(0),
	selection_(sel)
{
	if(sel == match_path_info) {
		script_name_ = booster::regex(non);
	}
	else {
		path_info_ = booster::regex(non);
	}
}